

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_semaphores.cpp
# Opt level: O2

void semaphores_in_module(uint W)

{
  char *pcVar1;
  code *pcVar2;
  double dVar3;
  FlowBuilder this;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  pointer this_00;
  ulong uVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  size_t N;
  Expression_lhs<const_unsigned_long_&> local_3e0;
  ResultBuilder DOCTEST_RB;
  vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> semaphores;
  Task t;
  String local_338;
  Task m;
  size_t counter;
  Semaphore *local_310;
  shared_ptr<tf::WorkerInterface> local_308;
  Taskflow taskflow2;
  Taskflow taskflow1;
  Executor executor;
  
  tf::Taskflow::Taskflow(&taskflow1);
  tf::Taskflow::Taskflow(&taskflow2);
  local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_308);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::vector
            (&semaphores,10,(allocator_type *)&DOCTEST_RB);
  local_310 = semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>._M_impl.
              super__Vector_impl_data._M_finish;
  this_00 = semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (this_00 == local_310) {
      counter = 0;
      N = 0x400;
      for (uVar4 = 0; this._graph = taskflow1.super_FlowBuilder._graph, uVar4 < 0x400;
          uVar4 = uVar4 + 1) {
        DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
        ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
        *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
             &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
        *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) =
             0;
        *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
        pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
        (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
        *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
        *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
        (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
        DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
        *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
             &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
        DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
        *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
        *(size_t **)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = &counter;
        DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
             (char *)std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp:242:32)>
                     ::_M_invoke;
        DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
             (double)std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp:242:32)>
                     ::_M_manager;
        *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
        DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
        DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
        std::
        vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                  ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                    *)this._graph,
                   (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
        std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                  ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
        t._node = ((this._graph)->
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ).
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
                  super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
                  super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
        tf::Task::
        acquire<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
                  (&t,(__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                       )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                    )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        tf::Task::
        release<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
                  (&t,(__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                       )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                    )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
      }
      tf::FlowBuilder::composed_of<tf::Taskflow>((FlowBuilder *)&m,&taskflow2);
      tf::Task::
      acquire<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
                (&m,(__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                     )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                  )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      tf::Task::
      release<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
                (&m,(__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                     )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                  )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      tf::Executor::run((Future<void> *)&DOCTEST_RB,&executor,&taskflow2);
      std::future<void>::get((future<void> *)&DOCTEST_RB);
      tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3e0.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0xfd;
      DOCTEST_RB.super_AssertData.m_expr = "counter == N";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_3e0.lhs = &counter;
      DOCTEST_RB.super_AssertData.m_at = local_3e0.m_at;
      doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<unsigned_long,_nullptr>
                ((Result *)&t,&local_3e0,&N);
      doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,(Result *)&t);
      doctest::String::~String(&local_338);
      dVar3 = doctest::detail::ResultBuilder::log
                        (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      if (extraout_AL_03 != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::ResultBuilder::react(&DOCTEST_RB);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
      std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::~vector(&semaphores);
      tf::Executor::~Executor(&executor);
      tf::Taskflow::~Taskflow(&taskflow2);
      tf::Taskflow::~Taskflow(&taskflow1);
      return;
    }
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0xe7;
    DOCTEST_RB.super_AssertData.m_expr = "sema.value() == 0";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_3e0.lhs = (unsigned_long *)tf::Semaphore::value(this_00);
    local_3e0.m_at = DT_REQUIRE;
    N = N & 0xffffffff00000000;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              ((Result *)&t,(Expression_lhs<unsigned_long_const> *)&local_3e0,(int *)&N);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,(Result *)&t);
    doctest::String::~String(&local_338);
    dVar3 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                       (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_3e0.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0xe8;
    DOCTEST_RB.super_AssertData.m_expr = "sema.max_value() == 0";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_3e0.lhs = (unsigned_long *)this_00->_max_value;
    N = N & 0xffffffff00000000;
    DOCTEST_RB.super_AssertData.m_at = local_3e0.m_at;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              ((Result *)&t,(Expression_lhs<unsigned_long_const> *)&local_3e0,(int *)&N);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,(Result *)&t);
    doctest::String::~String(&local_338);
    dVar3 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                       (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    if (extraout_AL_00 != '\0') break;
    doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    tf::Semaphore::reset(this_00,2);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0xea;
    DOCTEST_RB.super_AssertData.m_expr = "sema.value() == 2";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_3e0.lhs = (unsigned_long *)tf::Semaphore::value(this_00);
    local_3e0.m_at = DT_REQUIRE;
    N = CONCAT44(N._4_4_,2);
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              ((Result *)&t,(Expression_lhs<unsigned_long_const> *)&local_3e0,(int *)&N);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,(Result *)&t);
    doctest::String::~String(&local_338);
    dVar3 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                       (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    if (extraout_AL_01 != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_3e0.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0xeb;
    DOCTEST_RB.super_AssertData.m_expr = "sema.max_value() == 2";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_3e0.lhs = (unsigned_long *)this_00->_max_value;
    N = CONCAT44(N._4_4_,2);
    DOCTEST_RB.super_AssertData.m_at = local_3e0.m_at;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              ((Result *)&t,(Expression_lhs<unsigned_long_const> *)&local_3e0,(int *)&N);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,(Result *)&t);
    doctest::String::~String(&local_338);
    dVar3 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                       (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
    if (extraout_AL_02 != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    this_00 = this_00 + 1;
  }
  pcVar2 = (code *)swi(3);
  (*pcVar2)(SUB84(dVar3,0));
  return;
}

Assistant:

void semaphores_in_module(unsigned W) {
  
  tf::Taskflow taskflow1;
  tf::Taskflow taskflow2;
  tf::Executor executor(W);
  std::vector<tf::Semaphore> semaphores(10);

  for(auto& sema : semaphores) {
    REQUIRE(sema.value() == 0);
    REQUIRE(sema.max_value() == 0);
    sema.reset(2);
    REQUIRE(sema.value() == 2);
    REQUIRE(sema.max_value() == 2);
  }

  size_t N = 1024;
  size_t counter {0};  

  for(size_t i=0; i<N; i=i+1){
    auto t = taskflow1.emplace([&](){ counter++; });
    t.acquire(semaphores.begin(), semaphores.end());
    t.release(semaphores.begin(), semaphores.end());
  }

  auto m = taskflow2.composed_of(taskflow1);

  m.acquire(semaphores.begin(), semaphores.end());
  m.release(semaphores.begin(), semaphores.end()); 

  executor.run(taskflow2).get();
  REQUIRE(counter == N);
}